

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::has_element(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  __m128i match;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  probe_seq<16UL> seq;
  probe_seq<16UL> local_38;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    bVar6 = false;
  }
  else {
    probe(&local_38,this,hashval);
    auVar7 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar7 = pshuflw(auVar7,auVar7,0);
    while( true ) {
      pcVar1 = this->ctrl_ + local_38.offset_;
      cVar3 = pcVar1[0xf];
      cVar9 = auVar7[0];
      auVar10[0] = -(cVar9 == *pcVar1);
      cVar11 = auVar7[1];
      auVar10[1] = -(cVar11 == pcVar1[1]);
      cVar12 = auVar7[2];
      auVar10[2] = -(cVar12 == pcVar1[2]);
      cVar13 = auVar7[3];
      auVar10[3] = -(cVar13 == pcVar1[3]);
      auVar10[4] = -(cVar9 == pcVar1[4]);
      auVar10[5] = -(cVar11 == pcVar1[5]);
      auVar10[6] = -(cVar12 == pcVar1[6]);
      auVar10[7] = -(cVar13 == pcVar1[7]);
      auVar10[8] = -(cVar9 == pcVar1[8]);
      auVar10[9] = -(cVar11 == pcVar1[9]);
      auVar10[10] = -(cVar12 == pcVar1[10]);
      auVar10[0xb] = -(cVar13 == pcVar1[0xb]);
      auVar10[0xc] = -(cVar9 == pcVar1[0xc]);
      auVar10[0xd] = -(cVar11 == pcVar1[0xd]);
      auVar10[0xe] = -(cVar12 == pcVar1[0xe]);
      auVar10[0xf] = -(cVar13 == cVar3);
      for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar10[0xf] >> 7) << 0xf); bVar6 = uVar4 != 0, bVar6;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        if (this->slots_[uVar2 + local_38.offset_ & local_38.mask_] == *elem) {
          return bVar6;
        }
      }
      auVar8[0] = -(*pcVar1 == -0x80);
      auVar8[1] = -(pcVar1[1] == -0x80);
      auVar8[2] = -(pcVar1[2] == -0x80);
      auVar8[3] = -(pcVar1[3] == -0x80);
      auVar8[4] = -(pcVar1[4] == -0x80);
      auVar8[5] = -(pcVar1[5] == -0x80);
      auVar8[6] = -(pcVar1[6] == -0x80);
      auVar8[7] = -(pcVar1[7] == -0x80);
      auVar8[8] = -(pcVar1[8] == -0x80);
      auVar8[9] = -(pcVar1[9] == -0x80);
      auVar8[10] = -(pcVar1[10] == -0x80);
      auVar8[0xb] = -(pcVar1[0xb] == -0x80);
      auVar8[0xc] = -(pcVar1[0xc] == -0x80);
      auVar8[0xd] = -(pcVar1[0xd] == -0x80);
      auVar8[0xe] = -(pcVar1[0xe] == -0x80);
      auVar8[0xf] = -(cVar3 == -0x80);
      if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar8 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar8 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar8 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar8 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar8 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar3 == -0x80)
      break;
      lVar5 = local_38.offset_ + local_38.index_;
      local_38.index_ = local_38.index_ + 0x10;
      local_38.offset_ = lVar5 + 0x10U & local_38.mask_;
      if (this->capacity_ <= local_38.index_) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::Enum>]"
                     );
      }
    }
  }
  return bVar6;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }